

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc,int is_second_flight)

{
  ptls_iovec_t *ppVar1;
  st_ptls_get_time_t *psVar2;
  uint8_t *puVar3;
  st_ptls_encrypt_ticket_t *psVar4;
  ptls_key_exchange_algorithm_t *ppVar5;
  ptls_hash_algorithm_t *algo;
  ptls_iovec_t hash_value;
  ptls_iovec_t ikm;
  int iVar6;
  int iVar7;
  ptls_key_exchange_algorithm_t **pppVar8;
  ulong uVar9;
  ptls_key_schedule_t *ppVar10;
  anon_struct_168_2_32182ca3_for_identities *paVar11;
  char *pcVar12;
  ulong uVar13;
  ptls_hash_context_t **pppVar14;
  size_t sVar15;
  ptls_context_t *ppVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ptls_iovec_t secret_00;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  uint32_t age_add;
  ptls_iovec_t secret;
  uint64_t issue_at;
  ptls_iovec_t ticket_ctx;
  ptls_iovec_t ticket_negotiated_protocol;
  uint8_t binder_key [64];
  uint16_t local_124;
  uint16_t local_122;
  anon_struct_168_2_32182ca3_for_identities *local_120;
  uint *local_118;
  uint32_t local_10c;
  ptls_buffer_t local_108;
  uint64_t local_e0;
  ptls_iovec_t local_d8;
  uint8_t *local_c0;
  size_t local_b8;
  ulong local_b0;
  ptls_iovec_t local_a8;
  ptls_iovec_t local_98;
  uint8_t *local_88;
  size_t sStack_80;
  undefined1 local_78 [72];
  
  local_b8 = ch_trunc.len;
  local_c0 = ch_trunc.base;
  psVar2 = tls->ctx->get_time;
  local_118 = (uint *)accept_early_data;
  local_e0 = (*psVar2->cb)(psVar2);
  local_108.base = "";
  local_108.capacity = 0;
  local_108.off = 0;
  local_108.is_allocated = '\0';
  local_108.align_bits = '\0';
  *psk_index = 0;
  if ((ch->psk).identities.count != 0) {
    paVar11 = &(ch->psk).identities;
    uVar13 = 0;
    local_120 = paVar11;
    do {
      ppVar1 = &paVar11->list[uVar13].identity;
      ppVar16 = tls->ctx;
      puVar3 = (ppVar16->pre_shared_key).identity.base;
      if (puVar3 == (uint8_t *)0x0) {
        psVar4 = ppVar16->encrypt_ticket;
        if ((psVar4 != (st_ptls_encrypt_ticket_t *)0x0) &&
           (ppVar16->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
          bVar17 = uVar13 == 0;
          local_108.off = 0;
          iVar6 = (*psVar4->cb)(psVar4,tls,0,&local_108,*ppVar1);
          if (iVar6 != 0) {
            paVar11 = local_120;
            if (iVar6 != 0x209) goto LAB_00120c63;
            bVar17 = false;
          }
          iVar6 = decode_session_identifier
                            (&local_b0,&local_d8,&local_10c,&local_a8,&local_122,&local_124,
                             &local_98,local_108.base,local_108.base + local_108.off);
          sVar15 = local_a8.len;
          paVar11 = local_120;
          if (((iVar6 == 0) && (local_b0 <= local_e0)) &&
             (ppVar16 = tls->ctx, local_e0 - local_b0 <= (ulong)ppVar16->ticket_lifetime * 1000)) {
            *local_118 = 0;
            if (!(bool)(bVar17 ^ 1U | ((ch->psk).field_0xb4 & 1) == 0)) {
              uVar9 = local_e0 - (local_b0 + (*(int *)&ppVar1[1].base - local_10c));
              uVar13 = -uVar9;
              if (0 < (long)uVar9) {
                uVar13 = uVar9;
              }
              if ((ppVar16->max_early_data_size != 0) && (uVar13 < 0x2711)) {
                *local_118 = 1;
              }
            }
            if (((ppVar16->ticket_context).field_0x20 & 1) == 0) {
              pcVar12 = tls->server_name;
              if (local_a8.len == 0) {
                if (pcVar12 == (char *)0x0) goto LAB_00120d82;
              }
              else if (((pcVar12 != (char *)0x0) &&
                       (iVar6 = strncmp((char *)local_a8.base,pcVar12,local_a8.len),
                       paVar11 = local_120, iVar6 == 0)) && (pcVar12[sVar15] == '\0')) {
LAB_00120d82:
                sVar15 = local_98.len;
                pppVar8 = ppVar16->key_exchanges;
                ppVar5 = *pppVar8;
                while (paVar11 = local_120, ppVar5 != (ptls_key_exchange_algorithm_t *)0x0) {
                  pppVar8 = pppVar8 + 1;
                  if (ppVar5->id == local_122) {
                    tls->key_share = ppVar5;
                    if ((local_124 == tls->cipher_suite->id) &&
                       (((local_98.len == 0 ||
                         (((pcVar12 = tls->negotiated_protocol, pcVar12 != (char *)0x0 &&
                           (iVar6 = strncmp((char *)local_98.base,pcVar12,local_98.len),
                           paVar11 = local_120, iVar6 == 0)) && (pcVar12[sVar15] == '\0')))) &&
                        ((ppVar10 = tls->key_schedule, paVar11 = local_120,
                         local_d8.len == (ppVar10->hashes[0].algo)->digest_size &&
                         (local_120->list[*psk_index].binder.len == local_d8.len))))))
                    goto LAB_00120ef2;
                    break;
                  }
                  ppVar5 = *pppVar8;
                }
              }
            }
            else if ((local_a8.len == 0x20) &&
                    (auVar19[0] = -((ppVar16->ticket_context).bytes[0] == *local_a8.base),
                    auVar19[1] = -((ppVar16->ticket_context).bytes[1] == local_a8.base[1]),
                    auVar19[2] = -((ppVar16->ticket_context).bytes[2] == local_a8.base[2]),
                    auVar19[3] = -((ppVar16->ticket_context).bytes[3] == local_a8.base[3]),
                    auVar19[4] = -((ppVar16->ticket_context).bytes[4] == local_a8.base[4]),
                    auVar19[5] = -((ppVar16->ticket_context).bytes[5] == local_a8.base[5]),
                    auVar19[6] = -((ppVar16->ticket_context).bytes[6] == local_a8.base[6]),
                    auVar19[7] = -((ppVar16->ticket_context).bytes[7] == local_a8.base[7]),
                    auVar19[8] = -((ppVar16->ticket_context).bytes[8] == local_a8.base[8]),
                    auVar19[9] = -((ppVar16->ticket_context).bytes[9] == local_a8.base[9]),
                    auVar19[10] = -((ppVar16->ticket_context).bytes[10] == local_a8.base[10]),
                    auVar19[0xb] = -((ppVar16->ticket_context).bytes[0xb] == local_a8.base[0xb]),
                    auVar19[0xc] = -((ppVar16->ticket_context).bytes[0xc] == local_a8.base[0xc]),
                    auVar19[0xd] = -((ppVar16->ticket_context).bytes[0xd] == local_a8.base[0xd]),
                    auVar19[0xe] = -((ppVar16->ticket_context).bytes[0xe] == local_a8.base[0xe]),
                    auVar19[0xf] = -((ppVar16->ticket_context).bytes[0xf] == local_a8.base[0xf]),
                    auVar18[0] = -((ppVar16->ticket_context).bytes[0x10] == local_a8.base[0x10]),
                    auVar18[1] = -((ppVar16->ticket_context).bytes[0x11] == local_a8.base[0x11]),
                    auVar18[2] = -((ppVar16->ticket_context).bytes[0x12] == local_a8.base[0x12]),
                    auVar18[3] = -((ppVar16->ticket_context).bytes[0x13] == local_a8.base[0x13]),
                    auVar18[4] = -((ppVar16->ticket_context).bytes[0x14] == local_a8.base[0x14]),
                    auVar18[5] = -((ppVar16->ticket_context).bytes[0x15] == local_a8.base[0x15]),
                    auVar18[6] = -((ppVar16->ticket_context).bytes[0x16] == local_a8.base[0x16]),
                    auVar18[7] = -((ppVar16->ticket_context).bytes[0x17] == local_a8.base[0x17]),
                    auVar18[8] = -((ppVar16->ticket_context).bytes[0x18] == local_a8.base[0x18]),
                    auVar18[9] = -((ppVar16->ticket_context).bytes[0x19] == local_a8.base[0x19]),
                    auVar18[10] = -((ppVar16->ticket_context).bytes[0x1a] == local_a8.base[0x1a]),
                    auVar18[0xb] = -((ppVar16->ticket_context).bytes[0x1b] == local_a8.base[0x1b]),
                    auVar18[0xc] = -((ppVar16->ticket_context).bytes[0x1c] == local_a8.base[0x1c]),
                    auVar18[0xd] = -((ppVar16->ticket_context).bytes[0x1d] == local_a8.base[0x1d]),
                    auVar18[0xe] = -((ppVar16->ticket_context).bytes[0x1e] == local_a8.base[0x1e]),
                    auVar18[0xf] = -((ppVar16->ticket_context).bytes[0x1f] == local_a8.base[0x1f]),
                    auVar18 = auVar18 & auVar19,
                    (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00120d82;
          }
        }
      }
      else if ((ppVar1->len == (ppVar16->pre_shared_key).identity.len) &&
              (iVar6 = bcmp(ppVar1->base,puVar3,ppVar1->len), paVar11 = local_120, iVar6 == 0)) {
        *local_118 = (uint)(byte)(uVar13 == 0 & (ch->psk).field_0xb4);
        tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
        local_d8.base = (ppVar16->pre_shared_key).secret.base;
        local_d8.len = (ppVar16->pre_shared_key).secret.len;
        ppVar10 = tls->key_schedule;
LAB_00120ef2:
        if (is_second_flight == 0) {
          ikm.len = local_d8.len;
          ikm.base = local_d8.base;
          iVar6 = key_schedule_extract(ppVar10,ikm);
          if (iVar6 != 0) goto LAB_00120e63;
          ppVar16 = tls->ctx;
          ppVar10 = tls->key_schedule;
        }
        pcVar12 = "ext binder";
        if ((ppVar16->pre_shared_key).secret.base == (uint8_t *)0x0) {
          pcVar12 = "res binder";
        }
        algo = ppVar10->hashes[0].algo;
        local_88 = algo->empty_digest;
        sStack_80 = algo->digest_size;
        secret_00.base = ppVar10->secret;
        hash_value.len = sStack_80;
        hash_value.base = local_88;
        secret_00.len = sStack_80;
        iVar6 = ptls_hkdf_expand_label
                          (algo,local_78,sStack_80,secret_00,pcVar12,hash_value,(char *)0x0);
        puVar3 = local_c0;
        if (iVar6 == 0) {
          ppVar10 = tls->key_schedule;
          if (ppVar10->num_hashes != 0) {
            pppVar14 = &ppVar10->hashes[0].ctx;
            sVar15 = 0;
            do {
              (*(*pppVar14)->update)(*pppVar14,puVar3,local_b8);
              sVar15 = sVar15 + 1;
              pppVar14 = pppVar14 + 3;
            } while (sVar15 != ppVar10->num_hashes);
            ppVar10 = tls->key_schedule;
          }
          iVar6 = calc_verify_data(local_78,ppVar10,local_78);
          if (iVar6 == 0) {
            iVar7 = (*ptls_mem_equal)(local_120->list[*psk_index].binder.base,local_78,
                                      (tls->key_schedule->hashes[0].algo)->digest_size);
            iVar6 = 0x33;
            if (iVar7 != 0) {
              iVar6 = 0;
            }
          }
        }
        goto LAB_00120e63;
      }
LAB_00120c63:
      uVar13 = *psk_index + 1;
      *psk_index = uVar13;
    } while (uVar13 < (ch->psk).identities.count);
  }
  *psk_index = 0xffffffffffffffff;
  *local_118 = 0;
  tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
  iVar6 = 0;
LAB_00120e63:
  (*ptls_clear_memory)(local_108.base,local_108.off);
  if (local_108.is_allocated != '\0') {
    free(local_108.base);
  }
  local_108.off = 0;
  local_108.is_allocated = '\0';
  local_108.align_bits = '\0';
  local_108._26_6_ = 0;
  local_108.base = (uint8_t *)0x0;
  local_108.capacity = 0;
  (*ptls_clear_memory)(local_78,0x40);
  return iVar6;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc, int is_second_flight)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t secret, ticket_ctx, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        ptls_client_hello_psk_identity_t *identity = ch->psk.identities.list + *psk_index;

        /* negotiate using fixed pre-shared key */
        if (tls->ctx->pre_shared_key.identity.base != NULL) {
            if (identity->identity.len == tls->ctx->pre_shared_key.identity.len &&
                memcmp(identity->identity.base, tls->ctx->pre_shared_key.identity.base, identity->identity.len) == 0) {
                *accept_early_data = ch->psk.early_data_indication && *psk_index == 0;
                tls->key_share = NULL;
                secret = tls->ctx->pre_shared_key.secret;
                goto Found;
            }
            continue;
        }

        /* decrypt ticket and decode */
        if (tls->ctx->encrypt_ticket == NULL || tls->ctx->key_exchanges == NULL)
            continue;
        int can_accept_early_data = *psk_index == 0;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &secret, &age_add, &ticket_ctx, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check ticket context */
        if (tls->ctx->ticket_context.is_set) {
            if (!(ticket_ctx.len == sizeof(tls->ctx->ticket_context.bytes) &&
                  memcmp(ticket_ctx.base, tls->ctx->ticket_context.bytes, ticket_ctx.len) == 0))
                continue;
        } else {
            /* check server-name */
            if (ticket_ctx.len != 0) {
                if (tls->server_name == NULL)
                    continue;
                if (!vec_is_string(ticket_ctx, tls->server_name))
                    continue;
            } else {
                if (tls->server_name != NULL)
                    continue;
            }
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (secret.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if (!is_second_flight && (ret = key_schedule_extract(tls->key_schedule, secret)) != 0)
        goto Exit;
    if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key,
                                               tls->ctx->pre_shared_key.secret.base != NULL ? "ext binder" : "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len, 0);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}